

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindowlayout.cpp
# Opt level: O2

void __thiscall QMainWindowLayout::updateGapIndicator(QMainWindowLayout *this)

{
  QPointer *this_00;
  QWeakPointer<QObject> *this_01;
  bool bVar1;
  QWidget *p;
  QObject *ptr;
  int __sig;
  QRect *geom;
  QAnyStringView QVar2;
  
  bVar1 = QWidgetAnimator::animating((QWidgetAnimator *)(this + 0x790));
  if (bVar1) {
LAB_00403672:
    bVar1 = QPointer::operator_cast_to_bool((QPointer *)(this + 0x7e0));
    if (bVar1) {
      QWidget::hide(*(QWidget **)(this + 0x7e8));
      return;
    }
    return;
  }
  if (*(long *)(this + 0x7c0) == 0) {
    bVar1 = QPointer::operator_cast_to_bool((QPointer *)(this + 0x7f0));
    if (!bVar1) goto LAB_00403672;
  }
  this_00 = (QPointer *)(this + 0x7f0);
  bVar1 = QPointer::operator_cast_to_bool(this_00);
  if (bVar1) {
    if ((*(long *)this_00 == 0) || (*(int *)(*(long *)this_00 + 4) == 0)) {
      p = (QWidget *)0x0;
    }
    else {
      p = *(QWidget **)(this + 0x7f8);
    }
  }
  else {
    p = QLayout::parentWidget((QLayout *)this);
  }
  this_01 = (QWeakPointer<QObject> *)(this + 0x7e0);
  bVar1 = QPointer::operator_cast_to_bool((QPointer *)this_01);
  if (bVar1) {
    if ((this_01->d != (Data *)0x0) &&
       (*(QWidget **)(*(long *)&(*(QWidget **)(this + 0x7e8))->field_0x8 + 0x10) != p)) {
      QWidget::setParent(*(QWidget **)(this + 0x7e8),p);
    }
  }
  else {
    ptr = (QObject *)operator_new(0x28);
    QRubberBand::QRubberBand((QRubberBand *)ptr,Rectangle,p);
    QWeakPointer<QObject>::assign<QObject>(this_01,ptr);
    QVar2.m_size = (size_t)"qt_rubberband";
    QVar2.field_0.m_data = ((anon_union_8_3_8ad491a7_for_QAnyStringView_6 *)(this + 0x7e8))->m_data;
    QObject::setObjectName(QVar2);
  }
  QObject::blockSignals(SUB81(*(undefined8 *)(this + 0x7e8),0));
  bVar1 = QPointer::operator_cast_to_bool(this_00);
  if (bVar1) {
    geom = (QRect *)(*(long *)(this + 0x7f8) + 0x28);
  }
  else {
    geom = (QRect *)(this + 0x7c8);
  }
  QRubberBand::setGeometry(*(QRubberBand **)(this + 0x7e8),geom);
  __sig = (int)geom;
  QWidget::show(*(QWidget **)(this + 0x7e8));
  QWidget::raise(*(QWidget **)(this + 0x7e8),__sig);
  QObject::blockSignals(SUB81(*(undefined8 *)(this + 0x7e8),0));
  return;
}

Assistant:

void QMainWindowLayout::updateGapIndicator()
{
#if QT_CONFIG(rubberband)
    if (!widgetAnimator.animating() && (!currentGapPos.isEmpty()
#if QT_CONFIG(dockwidget)
                                        || currentHoveredFloat
#endif
                                        )) {
        QWidget *expectedParent =
#if QT_CONFIG(dockwidget)
            currentHoveredFloat ? currentHoveredFloat.data() :
#endif
            parentWidget();
        if (!gapIndicator) {
            gapIndicator = new QRubberBand(QRubberBand::Rectangle, expectedParent);
            // For accessibility to identify this special widget.
            gapIndicator->setObjectName("qt_rubberband"_L1);
        } else if (gapIndicator->parent() != expectedParent) {
            gapIndicator->setParent(expectedParent);
        }

        // Prevent re-entry in case of size change
        const bool sigBlockState = gapIndicator->signalsBlocked();
        auto resetSignals = qScopeGuard([this, sigBlockState](){ gapIndicator->blockSignals(sigBlockState); });
        gapIndicator->blockSignals(true);

#if QT_CONFIG(dockwidget)
        if (currentHoveredFloat)
            gapIndicator->setGeometry(currentHoveredFloat->currentGapRect);
        else
#endif
            gapIndicator->setGeometry(currentGapRect);

        gapIndicator->show();
        gapIndicator->raise();

        // Reset signal state

    } else if (gapIndicator) {
        gapIndicator->hide();
    }

#endif // QT_CONFIG(rubberband)
}